

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NodeSetChoiceLevel_rec(Abc_Obj_t *pNode,int fMaximum)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar4;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *paVar5;
  
  iVar2 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    iVar3 = Abc_NodeSetChoiceLevel_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],fMaximum);
    iVar2 = Abc_NodeSetChoiceLevel_rec
                      ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],fMaximum)
    ;
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    iVar2 = iVar2 + 1;
    if ((Abc_Obj_t *)(pNode->field_5).pData == (Abc_Obj_t *)0x0) {
      aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar2;
    }
    else {
      iVar3 = Abc_NodeSetChoiceLevel_rec((Abc_Obj_t *)(pNode->field_5).pData,fMaximum);
      if (fMaximum == 0) {
        if (iVar3 <= iVar2) {
          iVar2 = iVar3;
        }
      }
      else if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
      aVar4 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar2;
      paVar5 = &pNode->field_5;
      while (pvVar1 = paVar5->pData, pvVar1 != (void *)0x0) {
        *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)((long)pvVar1 + 0x40) = aVar4;
        paVar5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)pvVar1 + 0x38);
      }
    }
    pNode->field_6 = aVar4;
  }
  else {
    iVar2 = (pNode->field_6).iTemp;
  }
  return iVar2;
}

Assistant:

int Abc_NodeSetChoiceLevel_rec( Abc_Obj_t * pNode, int fMaximum )
{
    Abc_Obj_t * pTemp;
    int Level1, Level2, Level, LevelE;
    // skip the visited node
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return (int)(ABC_PTRINT_T)pNode->pCopy;
    Abc_NodeSetTravIdCurrent( pNode );
    // compute levels of the children nodes
    Level1 = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin0(pNode), fMaximum );
    Level2 = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin1(pNode), fMaximum );
    Level  = 1 + Abc_MaxInt( Level1, Level2 );
    if ( pNode->pData )
    {
        LevelE = Abc_NodeSetChoiceLevel_rec( (Abc_Obj_t *)pNode->pData, fMaximum );
        if ( fMaximum )
            Level = Abc_MaxInt( Level, LevelE );
        else
            Level = Abc_MinInt( Level, LevelE );
        // set the level of all equivalent nodes to be the same minimum
        for ( pTemp = (Abc_Obj_t *)pNode->pData; pTemp; pTemp = (Abc_Obj_t *)pTemp->pData )
            pTemp->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)Level;
    }
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)Level;
    return Level;
}